

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

curl_socket_t Curl_getconnectinfo(Curl_easy *data,connectdata **connp)

{
  long conn_id;
  connectdata *pcVar1;
  curl_socket_t cVar2;
  
  conn_id = (data->state).lastconnect_id;
  cVar2 = -1;
  if (conn_id != -1) {
    pcVar1 = Curl_cpool_get_conn(data,conn_id);
    if (pcVar1 == (connectdata *)0x0) {
      (data->state).lastconnect_id = -1;
    }
    else {
      if (connp != (connectdata **)0x0) {
        *connp = pcVar1;
      }
      cVar2 = pcVar1->sock[0];
    }
  }
  return cVar2;
}

Assistant:

curl_socket_t Curl_getconnectinfo(struct Curl_easy *data,
                                  struct connectdata **connp)
{
  DEBUGASSERT(data);

  /* this works for an easy handle:
   * - that has been used for curl_easy_perform()
   * - that is associated with a multi handle, and whose connection
   *   was detached with CURLOPT_CONNECT_ONLY
   */
  if(data->state.lastconnect_id != -1) {
    struct connectdata *conn;

    conn = Curl_cpool_get_conn(data, data->state.lastconnect_id);
    if(!conn) {
      data->state.lastconnect_id = -1;
      return CURL_SOCKET_BAD;
    }

    if(connp)
      /* only store this if the caller cares for it */
      *connp = conn;
    return conn->sock[FIRSTSOCKET];
  }
  return CURL_SOCKET_BAD;
}